

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

bool __thiscall minihttp::HttpSocket::_HandleStatus(HttpSocket *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  bool bVar6;
  string local_50;
  
  pcVar3 = Hdr(this,"content-length");
  if (pcVar3 == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = atoi(pcVar3);
  }
  this->_contentLen = uVar1;
  this->_remaining = uVar1;
  pcVar3 = Hdr(this,"transfer-encoding");
  if (pcVar3 == (char *)0x0) {
    bVar6 = false;
  }
  else {
    iVar2 = strncasecmp(pcVar3,"chunked",7);
    bVar6 = iVar2 == 0;
  }
  this->_chunkedTransfer = bVar6;
  pcVar3 = Hdr(this,"connection");
  if (pcVar3 == (char *)0x0) {
    bVar6 = true;
  }
  else {
    iVar2 = strncasecmp(pcVar3,"keep-alive",10);
    bVar6 = iVar2 != 0;
  }
  this->_mustClose = bVar6;
  uVar1 = this->_status - 100;
  if ((((0x69 < uVar1) && (uVar5 = this->_status - 0x12d, uVar5 < 8)) &&
      ((199U >> (uVar5 & 0x1f) & 1) != 0)) && (this->_followRedir == true)) {
    pcVar3 = Hdr(this,"location");
    if (pcVar3 != (char *)0x0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar4 = strlen(pcVar3);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar3,pcVar3 + sVar4);
      _Redirect(this,&local_50,(bool)(0x3cU >> ((byte)uVar5 & 0x1f) & 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return uVar1 < 0x6a;
}

Assistant:

bool HttpSocket::_HandleStatus()
{
    _remaining = _contentLen = safeatoi(Hdr("content-length"));

    const char *encoding = Hdr("transfer-encoding");
    _chunkedTransfer = encoding && !STRNICMP(encoding, "chunked", 7);

    const char *conn = Hdr("connection"); // if its not keep-alive, server will close it, so we can too
    _mustClose = !conn || STRNICMP(conn, "keep-alive", 10);

    // As per the spec, we also need to handle 1xx codes, but are free to ignore them
    const bool success = IsSuccess() || (_status >= 100 && _status <= 199);

    if(!(_chunkedTransfer || _contentLen) && success)
        traceprint("_ParseHeader: Not chunked transfer and content-length==0, this will go fail\n");

    traceprint("Got HTTP Status %d\n", _status);

    if(success)
        return true;

    bool forceGET = false;
    switch(_status)
    {
        case 303:
            forceGET = true; // As per spec, continue with a GET request
        case 301:
        case 302:
        case 307:
        case 308:
            if(_followRedir)
                if(const char *loc = Hdr("location"))
                    _Redirect(loc, forceGET);
            return false;

        default:
            return false;
    }
}